

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc_manager.cpp
# Opt level: O0

XmlRpcClient * __thiscall
miniros::RPCManager::getXMLRPCClient(RPCManager *this,string *host,int port,string *uri)

{
  const_iterator __position;
  __type_conflict _Var1;
  bool bVar2;
  int iVar3;
  pointer pCVar4;
  TimeBase<miniros::SteadyTime,_miniros::WallDuration> TVar5;
  XmlRpcClient *pXVar6;
  vector<miniros::CachedXmlRpcClient,_std::allocator<miniros::CachedXmlRpcClient>_> *this_00;
  SteadyTime __x;
  int in_EDX;
  CachedXmlRpcClient mc;
  iterator i;
  scoped_lock<std::mutex> lock;
  XmlRpcClient *c;
  XmlRpcClient *in_stack_fffffffffffffec8;
  CachedXmlRpcClient *in_stack_fffffffffffffed0;
  TimeBase<miniros::SteadyTime,_miniros::WallDuration> *in_stack_fffffffffffffed8;
  vector<miniros::CachedXmlRpcClient,_std::allocator<miniros::CachedXmlRpcClient>_>
  *in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffeec;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffef0;
  __normal_iterator<miniros::CachedXmlRpcClient_*,_std::vector<miniros::CachedXmlRpcClient,_std::allocator<miniros::CachedXmlRpcClient>_>_>
  *in_stack_ffffffffffffff28;
  undefined8 in_stack_ffffffffffffff30;
  uint32_t port_00;
  undefined7 in_stack_ffffffffffffff38;
  undefined1 in_stack_ffffffffffffff3f;
  XmlRpcClient *in_stack_ffffffffffffff40;
  bool local_a1;
  TimeBase<miniros::SteadyTime,_miniros::WallDuration> local_64;
  TimeBase<miniros::SteadyTime,_miniros::WallDuration> local_5c;
  TimeBase<miniros::SteadyTime,_miniros::WallDuration> local_54;
  CachedXmlRpcClient *local_40;
  __normal_iterator<miniros::CachedXmlRpcClient_*,_std::vector<miniros::CachedXmlRpcClient,_std::allocator<miniros::CachedXmlRpcClient>_>_>
  local_38 [2];
  XmlRpcClient *local_28;
  int local_14;
  
  local_28 = (XmlRpcClient *)0x0;
  local_14 = in_EDX;
  std::scoped_lock<std::mutex>::scoped_lock
            ((scoped_lock<std::mutex> *)in_stack_fffffffffffffed0,
             (mutex_type *)in_stack_fffffffffffffec8);
  local_38[0]._M_current =
       (CachedXmlRpcClient *)
       std::vector<miniros::CachedXmlRpcClient,_std::allocator<miniros::CachedXmlRpcClient>_>::begin
                 ((vector<miniros::CachedXmlRpcClient,_std::allocator<miniros::CachedXmlRpcClient>_>
                   *)in_stack_fffffffffffffec8);
  do {
    while( true ) {
      local_a1 = false;
      if (local_28 == (XmlRpcClient *)0x0) {
        local_40 = (CachedXmlRpcClient *)
                   std::
                   vector<miniros::CachedXmlRpcClient,_std::allocator<miniros::CachedXmlRpcClient>_>
                   ::end((vector<miniros::CachedXmlRpcClient,_std::allocator<miniros::CachedXmlRpcClient>_>
                          *)in_stack_fffffffffffffec8);
        local_a1 = __gnu_cxx::operator!=
                             ((__normal_iterator<miniros::CachedXmlRpcClient_*,_std::vector<miniros::CachedXmlRpcClient,_std::allocator<miniros::CachedXmlRpcClient>_>_>
                               *)in_stack_fffffffffffffed0,
                              (__normal_iterator<miniros::CachedXmlRpcClient_*,_std::vector<miniros::CachedXmlRpcClient,_std::allocator<miniros::CachedXmlRpcClient>_>_>
                               *)in_stack_fffffffffffffec8);
      }
      port_00 = (uint32_t)((ulong)in_stack_ffffffffffffff30 >> 0x20);
      if (local_a1 == false) goto LAB_00497bbd;
      pCVar4 = __gnu_cxx::
               __normal_iterator<miniros::CachedXmlRpcClient_*,_std::vector<miniros::CachedXmlRpcClient,_std::allocator<miniros::CachedXmlRpcClient>_>_>
               ::operator->(local_38);
      if ((pCVar4->in_use_ & 1U) == 0) break;
      __gnu_cxx::
      __normal_iterator<miniros::CachedXmlRpcClient_*,_std::vector<miniros::CachedXmlRpcClient,_std::allocator<miniros::CachedXmlRpcClient>_>_>
      ::operator++(local_38);
    }
    pCVar4 = __gnu_cxx::
             __normal_iterator<miniros::CachedXmlRpcClient_*,_std::vector<miniros::CachedXmlRpcClient,_std::allocator<miniros::CachedXmlRpcClient>_>_>
             ::operator->(local_38);
    XmlRpc::XmlRpcClient::getHost_abi_cxx11_(pCVar4->client_);
    _Var1 = std::operator==(in_stack_fffffffffffffef0,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
    if (_Var1) {
      pCVar4 = __gnu_cxx::
               __normal_iterator<miniros::CachedXmlRpcClient_*,_std::vector<miniros::CachedXmlRpcClient,_std::allocator<miniros::CachedXmlRpcClient>_>_>
               ::operator->(local_38);
      iVar3 = XmlRpc::XmlRpcClient::getPort(pCVar4->client_);
      if (iVar3 == local_14) {
        pCVar4 = __gnu_cxx::
                 __normal_iterator<miniros::CachedXmlRpcClient_*,_std::vector<miniros::CachedXmlRpcClient,_std::allocator<miniros::CachedXmlRpcClient>_>_>
                 ::operator->(local_38);
        in_stack_ffffffffffffff40 =
             (XmlRpcClient *)XmlRpc::XmlRpcClient::getUri_abi_cxx11_(pCVar4->client_);
        _Var1 = std::operator==(in_stack_fffffffffffffef0,
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
        if (_Var1) {
          pCVar4 = __gnu_cxx::
                   __normal_iterator<miniros::CachedXmlRpcClient_*,_std::vector<miniros::CachedXmlRpcClient,_std::allocator<miniros::CachedXmlRpcClient>_>_>
                   ::operator->(local_38);
          in_stack_ffffffffffffff3f = XmlRpc::XmlRpcClient::isReady(pCVar4->client_);
          if ((bool)in_stack_ffffffffffffff3f) {
            in_stack_ffffffffffffff28 = local_38;
            pCVar4 = __gnu_cxx::
                     __normal_iterator<miniros::CachedXmlRpcClient_*,_std::vector<miniros::CachedXmlRpcClient,_std::allocator<miniros::CachedXmlRpcClient>_>_>
                     ::operator->(in_stack_ffffffffffffff28);
            local_28 = pCVar4->client_;
            pCVar4 = __gnu_cxx::
                     __normal_iterator<miniros::CachedXmlRpcClient_*,_std::vector<miniros::CachedXmlRpcClient,_std::allocator<miniros::CachedXmlRpcClient>_>_>
                     ::operator->(in_stack_ffffffffffffff28);
            pCVar4->in_use_ = true;
            TVar5 = (TimeBase<miniros::SteadyTime,_miniros::WallDuration>)SteadyTime::now();
            local_54 = TVar5;
            pCVar4 = __gnu_cxx::
                     __normal_iterator<miniros::CachedXmlRpcClient_*,_std::vector<miniros::CachedXmlRpcClient,_std::allocator<miniros::CachedXmlRpcClient>_>_>
                     ::operator->(local_38);
            port_00 = TVar5.nsec;
            (pCVar4->last_use_time_).super_TimeBase<miniros::SteadyTime,_miniros::WallDuration> =
                 local_54;
LAB_00497bbd:
            if (local_28 == (XmlRpcClient *)0x0) {
              pXVar6 = (XmlRpcClient *)operator_new(0xf8);
              this_00 = (vector<miniros::CachedXmlRpcClient,_std::allocator<miniros::CachedXmlRpcClient>_>
                         *)std::__cxx11::string::c_str();
              std::__cxx11::string::c_str();
              XmlRpc::XmlRpcClient::XmlRpcClient
                        (in_stack_ffffffffffffff40,
                         (char *)CONCAT17(in_stack_ffffffffffffff3f,in_stack_ffffffffffffff38),
                         port_00,(char *)in_stack_ffffffffffffff28);
              local_28 = pXVar6;
              CachedXmlRpcClient::CachedXmlRpcClient
                        (in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
              __x = SteadyTime::now();
              std::vector<miniros::CachedXmlRpcClient,_std::allocator<miniros::CachedXmlRpcClient>_>
              ::push_back(this_00,(value_type *)
                                  __x.super_TimeBase<miniros::SteadyTime,_miniros::WallDuration>);
            }
            std::scoped_lock<std::mutex>::~scoped_lock((scoped_lock<std::mutex> *)0x497cd3);
            return local_28;
          }
        }
      }
    }
    __gnu_cxx::
    __normal_iterator<miniros::CachedXmlRpcClient_*,_std::vector<miniros::CachedXmlRpcClient,_std::allocator<miniros::CachedXmlRpcClient>_>_>
    ::operator->(local_38);
    local_5c = (TimeBase<miniros::SteadyTime,_miniros::WallDuration>)
               TimeBase<miniros::SteadyTime,_miniros::WallDuration>::operator+
                         (in_stack_fffffffffffffed8,(WallDuration *)in_stack_fffffffffffffed0);
    local_64 = (TimeBase<miniros::SteadyTime,_miniros::WallDuration>)SteadyTime::now();
    bVar2 = TimeBase<miniros::SteadyTime,_miniros::WallDuration>::operator<
                      (&local_5c,(SteadyTime *)&local_64);
    if (bVar2) {
      pCVar4 = __gnu_cxx::
               __normal_iterator<miniros::CachedXmlRpcClient_*,_std::vector<miniros::CachedXmlRpcClient,_std::allocator<miniros::CachedXmlRpcClient>_>_>
               ::operator->(local_38);
      if (pCVar4->client_ != (XmlRpcClient *)0x0) {
        (*(pCVar4->client_->super_XmlRpcSource)._vptr_XmlRpcSource[1])();
      }
      __gnu_cxx::
      __normal_iterator<miniros::CachedXmlRpcClient_const*,std::vector<miniros::CachedXmlRpcClient,std::allocator<miniros::CachedXmlRpcClient>>>
      ::__normal_iterator<miniros::CachedXmlRpcClient*>
                ((__normal_iterator<const_miniros::CachedXmlRpcClient_*,_std::vector<miniros::CachedXmlRpcClient,_std::allocator<miniros::CachedXmlRpcClient>_>_>
                  *)in_stack_fffffffffffffed0,
                 (__normal_iterator<miniros::CachedXmlRpcClient_*,_std::vector<miniros::CachedXmlRpcClient,_std::allocator<miniros::CachedXmlRpcClient>_>_>
                  *)in_stack_fffffffffffffec8);
      __position._M_current._4_4_ = in_stack_fffffffffffffeec;
      __position._M_current._0_4_ = in_stack_fffffffffffffee8;
      local_38[0]._M_current =
           (CachedXmlRpcClient *)
           std::vector<miniros::CachedXmlRpcClient,_std::allocator<miniros::CachedXmlRpcClient>_>::
           erase(in_stack_fffffffffffffee0,__position);
    }
    else {
      __gnu_cxx::
      __normal_iterator<miniros::CachedXmlRpcClient_*,_std::vector<miniros::CachedXmlRpcClient,_std::allocator<miniros::CachedXmlRpcClient>_>_>
      ::operator++(local_38);
    }
  } while( true );
}

Assistant:

XmlRpcClient* RPCManager::getXMLRPCClient(const std::string &host, const int port, const std::string &uri)
{
  // go through our vector of clients and grab the first available one
  XmlRpcClient *c = nullptr;

  std::scoped_lock<std::mutex> lock(clients_mutex_);

  for (auto i = clients_.begin(); !c && i != clients_.end(); )
  {
    if (!i->in_use_)
    {
      // see where it's pointing
      if (i->client_->getHost() == host &&
          i->client_->getPort() == port &&
          i->client_->getUri()  == uri)
      {
        // hooray, it's pointing at our destination. re-use it.
        if (i->client_->isReady()) {
          c = i->client_;
          i->in_use_ = true;
          i->last_use_time_ = SteadyTime::now();
          break;
        }
      }
      if (i->last_use_time_ + CachedXmlRpcClient::s_zombie_time_ < SteadyTime::now())
      {
        // toast this guy. he's dead and nobody is reusing him.
        delete i->client_;
        i = clients_.erase(i);
      }
      else
      {
        ++i; // move along. this guy isn't dead yet.
      }
    }
    else
    {
      ++i;
    }
  }

  if (!c)
  {
    // allocate a new one
    c = new XmlRpcClient(host.c_str(), port, uri.c_str());
    CachedXmlRpcClient mc(c);
    mc.in_use_ = true;
    mc.last_use_time_ = SteadyTime::now();
    clients_.push_back(mc);
    //ROS_INFO("%d xmlrpc clients allocated\n", xmlrpc_clients.size());
  }
  // ONUS IS ON THE RECEIVER TO UNSET THE IN_USE FLAG
  // by calling releaseXMLRPCClient
  return c;
}